

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

void Edg_ManCollectCritEdges(Gia_Man_t *p,Vec_Wec_t *vEdges,int DelayMax)

{
  undefined1 auVar1 [16];
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar1 = _DAT_0093d220;
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assert_fail("p->vEdge1 && p->vEdge2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x2f4,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
  }
  iVar5 = vEdges->nSize;
  if (0 < (long)iVar5) {
    pVVar2 = vEdges->pArray;
    lVar4 = (long)iVar5 + -1;
    auVar9._8_4_ = (int)lVar4;
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    auVar9 = auVar9 ^ _DAT_0093d220;
    auVar10 = _DAT_0093e4e0;
    auVar11 = _DAT_0093d210;
    do {
      auVar12 = auVar11 ^ auVar1;
      iVar3 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar3 && auVar9._0_4_ < auVar12._0_4_ || iVar3 < auVar12._4_4_)
                & 1)) {
        *(undefined4 *)((long)&pVVar2->nSize + lVar4) = 0;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        *(undefined4 *)((long)&pVVar2[1].nSize + lVar4) = 0;
      }
      auVar12 = auVar10 ^ auVar1;
      iVar6 = auVar12._4_4_;
      if (iVar6 <= iVar3 && (iVar6 != iVar3 || auVar12._0_4_ <= auVar9._0_4_)) {
        *(undefined4 *)((long)&pVVar2[2].nSize + lVar4) = 0;
        *(undefined4 *)((long)&pVVar2[3].nSize + lVar4) = 0;
      }
      lVar8 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar8 + 4;
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar8 + 4;
      lVar4 = lVar4 + 0x40;
    } while ((ulong)(iVar5 + 3U >> 2) << 6 != lVar4);
  }
  vEdges->nSize = 0;
  uVar7 = DelayMax + 1;
  iVar5 = vEdges->nCap;
  if (iVar5 <= DelayMax) {
    if (vEdges->pArray == (Vec_Int_t *)0x0) {
      pVVar2 = (Vec_Int_t *)malloc((long)(int)uVar7 << 4);
    }
    else {
      pVVar2 = (Vec_Int_t *)realloc(vEdges->pArray,(long)(int)uVar7 << 4);
      iVar5 = vEdges->nCap;
    }
    vEdges->pArray = pVVar2;
    memset(pVVar2 + iVar5,0,(long)(int)(uVar7 - iVar5) << 4);
    vEdges->nCap = uVar7;
  }
  vEdges->nSize = uVar7;
  iVar5 = p->nObjs;
  if (1 < iVar5) {
    lVar8 = 1;
    lVar4 = 0x14;
    do {
      if (p->vMapping2->nSize <= lVar8) {
LAB_001fa53c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (*(int *)((long)&p->vMapping2->pArray->nCap + lVar4) != 0) {
        if ((p->vEdgeDelay->nSize <= lVar8) || (p->vEdgeDelayR->nSize <= lVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar7 = p->vEdgeDelay->pArray[lVar8];
        iVar3 = p->vEdgeDelayR->pArray[lVar8] + uVar7;
        if (DelayMax < iVar3) {
          __assert_fail("Delay1 + Delay2 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                        ,0x2fb,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
        }
        if (iVar3 == DelayMax) {
          iVar5 = vEdges->nSize;
          if (iVar5 <= (int)uVar7) {
            iVar6 = uVar7 + 1;
            iVar3 = iVar5 * 2;
            if (iVar5 * 2 <= iVar6) {
              iVar3 = iVar6;
            }
            iVar5 = vEdges->nCap;
            if (iVar5 < iVar3) {
              if (vEdges->pArray == (Vec_Int_t *)0x0) {
                pVVar2 = (Vec_Int_t *)malloc((long)iVar3 << 4);
              }
              else {
                pVVar2 = (Vec_Int_t *)realloc(vEdges->pArray,(long)iVar3 << 4);
                iVar5 = vEdges->nCap;
              }
              vEdges->pArray = pVVar2;
              memset(pVVar2 + iVar5,0,(long)(iVar3 - iVar5) << 4);
              vEdges->nCap = iVar3;
            }
            vEdges->nSize = iVar6;
            iVar5 = iVar6;
          }
          if (((int)uVar7 < 0) || (iVar5 <= (int)uVar7)) goto LAB_001fa53c;
          Vec_IntPush(vEdges->pArray + uVar7,(int)lVar8);
          iVar5 = p->nObjs;
        }
      }
      lVar8 = lVar8 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar8 < iVar5);
    uVar7 = vEdges->nSize;
  }
  if (1 < (int)uVar7) {
    lVar4 = 0;
    do {
      if (*(int *)((long)&vEdges->pArray[1].nSize + lVar4) < 1) {
        __assert_fail("Vec_IntSize(vLevel) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                      ,0x302,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)uVar7 * 0x10 + -0x10 != lVar4);
  }
  return;
}

Assistant:

void Edg_ManCollectCritEdges( Gia_Man_t * p, Vec_Wec_t * vEdges, int DelayMax )
{
    Vec_Int_t * vLevel;
    int k, iLut, Delay1, Delay2;
    assert( p->vEdge1 && p->vEdge2 );
    Vec_WecClear( vEdges );
    Vec_WecInit( vEdges, DelayMax + 1 );
    Gia_ManForEachLut2( p, iLut )
    {
        Delay1 = Vec_IntEntry( p->vEdgeDelay, iLut );
        Delay2 = Vec_IntEntry( p->vEdgeDelayR, iLut );
        assert( Delay1 + Delay2 <= DelayMax );
        if ( Delay1 + Delay2 == DelayMax )
            Vec_WecPush( vEdges, Delay1, iLut );
    }
    // every level should have critical nodes, except the first one
    //Vec_WecPrint( vEdges, 0 );
    Vec_WecForEachLevelStart( vEdges, vLevel, k, 1 )
        assert( Vec_IntSize(vLevel) > 0 );
}